

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall duckdb::Serializer::WriteValue<duckdb::Expression>(Serializer *this,Expression *ptr)

{
  if (ptr == (Expression *)0x0) {
    (*this->_vptr_Serializer[10])(this,0);
  }
  else {
    (*this->_vptr_Serializer[10])(this,1);
    (*this->_vptr_Serializer[6])(this);
    (*(ptr->super_BaseExpression)._vptr_BaseExpression[0x12])(ptr,this);
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[0xb])(this);
  return;
}

Assistant:

void WriteValue(const T *ptr) {
		if (ptr == nullptr) {
			OnNullableBegin(false);
			OnNullableEnd();
		} else {
			OnNullableBegin(true);
			WriteValue(*ptr);
			OnNullableEnd();
		}
	}